

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# textures.cpp
# Opt level: O0

WindyTexture *
pbrt::WindyTexture::Create
          (Transform *renderFromTexture,TextureParameterDictionary *parameters,FileLoc *loc,
          Allocator alloc)

{
  WindyTexture *pWVar1;
  polymorphic_allocator<std::byte> *in_RDX;
  TextureParameterDictionary *in_RSI;
  TextureMapping3DHandle map;
  FileLoc *in_stack_00000050;
  Transform *in_stack_00000058;
  ParameterDictionary *in_stack_00000060;
  Allocator in_stack_00000068;
  TextureMapping3DHandle *in_stack_ffffffffffffffd8;
  
  TextureParameterDictionary::operator_cast_to_ParameterDictionary_(in_RSI);
  TextureMapping3DHandle::Create
            (in_stack_00000060,in_stack_00000058,in_stack_00000050,in_stack_00000068);
  pWVar1 = pstd::pmr::polymorphic_allocator<std::byte>::
           new_object<pbrt::WindyTexture,pbrt::TextureMapping3DHandle&>
                     (in_RDX,in_stack_ffffffffffffffd8);
  return pWVar1;
}

Assistant:

WindyTexture *WindyTexture::Create(const Transform &renderFromTexture,
                                   const TextureParameterDictionary &parameters,
                                   const FileLoc *loc, Allocator alloc) {
    // Initialize 3D texture mapping _map_ from _tp_
    TextureMapping3DHandle map =
        TextureMapping3DHandle::Create(parameters, renderFromTexture, loc, alloc);
    return alloc.new_object<WindyTexture>(map);
}